

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_hash_set.c
# Opt level: O2

_Bool TIFFHashSetRehash(TIFFHashSet *set)

{
  int iVar1;
  _TIFFList *p_Var2;
  TIFFList **ppTVar3;
  unsigned_long uVar4;
  ulong uVar5;
  int i;
  long lVar6;
  TIFFList *pTVar7;
  
  iVar1 = anPrimes[set->nIndiceAllocatedSize];
  ppTVar3 = (TIFFList **)calloc(8,(long)iVar1);
  if (ppTVar3 != (TIFFList **)0x0) {
    for (lVar6 = 0; lVar6 < set->nAllocatedSize; lVar6 = lVar6 + 1) {
      pTVar7 = set->tabList[lVar6];
      while (pTVar7 != (TIFFList *)0x0) {
        uVar4 = (*set->fnHashFunc)(pTVar7->pData);
        uVar5 = uVar4 % (ulong)(long)iVar1;
        p_Var2 = pTVar7->psNext;
        pTVar7->psNext = ppTVar3[uVar5];
        ppTVar3[uVar5] = pTVar7;
        pTVar7 = p_Var2;
      }
    }
    free(set->tabList);
    set->tabList = ppTVar3;
    set->nAllocatedSize = iVar1;
    set->bRehash = false;
  }
  return ppTVar3 != (TIFFList **)0x0;
}

Assistant:

static bool TIFFHashSetRehash(TIFFHashSet *set)
{
    int nNewAllocatedSize = anPrimes[set->nIndiceAllocatedSize];
    TIFFList **newTabList =
        (TIFFList **)(calloc(sizeof(TIFFList *), nNewAllocatedSize));
    if (newTabList == NULL)
        return false;
#ifdef HASH_DEBUG
    TIFFDebug("TIFFHASH",
              "hashSet=%p, nSize=%d, nCollisions=%d, "
              "fCollisionRate=%.02f",
              set, set->nSize, set->nCollisions,
              set->nCollisions * 100.0 / set->nSize);
    set->nCollisions = 0;
#endif
    for (int i = 0; i < set->nAllocatedSize; i++)
    {
        TIFFList *cur = set->tabList[i];
        while (cur)
        {
            const unsigned long nNewHashVal =
                set->fnHashFunc(cur->pData) % nNewAllocatedSize;
#ifdef HASH_DEBUG
            if (newTabList[nNewHashVal])
                set->nCollisions++;
#endif
            TIFFList *psNext = cur->psNext;
            cur->psNext = newTabList[nNewHashVal];
            newTabList[nNewHashVal] = cur;
            cur = psNext;
        }
    }
    free(set->tabList);
    set->tabList = newTabList;
    set->nAllocatedSize = nNewAllocatedSize;
    set->bRehash = false;
    return true;
}